

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void pinger_on_connect(uv_connect_t *req,int status)

{
  pinger_t *pinger;
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  pinger = (pinger_t *)req->handle->data;
  pinger_on_connect_count = pinger_on_connect_count + 1;
  eval_a = (int64_t)status;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = 1;
    iVar1 = uv_is_readable();
    eval_b = (int64_t)iVar1;
    if (eval_b == 1) {
      eval_a = 1;
      iVar1 = uv_is_writable(req->handle);
      eval_b = (int64_t)iVar1;
      if (eval_b == 1) {
        iVar1 = uv_is_closing(req->handle);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          pinger_write_ping(pinger);
          iVar1 = uv_read_start(req->handle,alloc_cb,pinger_read_cb);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            return;
          }
          pcVar4 = "0";
          pcVar3 = "uv_read_start((uv_stream_t*) req->handle, alloc_cb, pinger_read_cb)";
          uVar2 = 0xd2;
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_is_closing((uv_handle_t *) req->handle)";
          uVar2 = 0xcc;
        }
      }
      else {
        pcVar4 = "uv_is_writable(req->handle)";
        pcVar3 = "1";
        uVar2 = 0xcb;
      }
    }
    else {
      pcVar4 = "uv_is_readable(req->handle)";
      pcVar3 = "1";
      uVar2 = 0xca;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "status";
    uVar2 = 200;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void pinger_on_connect(uv_connect_t* req, int status) {
  pinger_t* pinger = (pinger_t*) req->handle->data;

  pinger_on_connect_count++;

  ASSERT_OK(status);

  ASSERT_EQ(1, uv_is_readable(req->handle));
  ASSERT_EQ(1, uv_is_writable(req->handle));
  ASSERT_OK(uv_is_closing((uv_handle_t *) req->handle));

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) req->handle,
                          alloc_cb,
                          pinger_read_cb));
}